

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void __thiscall Game::Game(Game *this)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  void *pvVar4;
  Memento *mem_00;
  Deal *this_00;
  Player *pPVar5;
  reference ppPVar6;
  char *ctx;
  string *local_248;
  bool local_219;
  string local_190 [32];
  string local_170 [35];
  bool local_14d;
  int local_14c;
  string local_148 [3];
  bool isComputer;
  int i;
  string name;
  allocator local_124;
  allocator local_123;
  allocator local_122;
  allocator local_121;
  string *local_120;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string asStack_98 [12];
  int local_8c;
  Player *local_88;
  Player *pPStack_80;
  Player *local_78;
  Player *pPStack_70;
  string local_50 [8];
  string q;
  Memento *mem;
  Cursor local_1c;
  Game *local_10;
  Game *this_local;
  
  local_10 = this;
  AdvancedConsole::Cursor::Cursor(&local_1c,0,0,AC_ABSOLUTE);
  poVar3 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_1c);
  AdvancedConsole::Erase::Erase((Erase *)((long)&mem + 4),AC_ALL,AC_SCREEN);
  AdvancedConsole::operator<<(poVar3,(Erase *)((long)&mem + 4));
  poVar3 = std::operator<<((ostream *)&std::cout,"Welcome to the Bridge Game.");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  mem_00 = Memento::loadFile(-1);
  if (mem_00 != (Memento *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Do you want to load last game?");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_50);
    std::operator<<((ostream *)&std::cout,"Yes(y) or No(n) : ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_50);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"y");
    if ((((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_50,"Y"), bVar1)) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_50,"yes"), bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50,"YES"), bVar1)) {
      reset(this,mem_00);
      this_00 = (Deal *)operator_new(0x48);
      local_88 = (this->_players)._M_elems[0];
      pPStack_80 = (this->_players)._M_elems[1];
      local_78 = (this->_players)._M_elems[2];
      pPStack_70 = (this->_players)._M_elems[3];
      Deal::Deal(this_00,(array<Player_*,_4UL>)*&(this->_players)._M_elems,0);
      this->_currentDeal = this_00;
      Deal::reset(this->_currentDeal,mem_00);
      local_8c = 1;
    }
    else {
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      local_8c = 0;
    }
    std::__cxx11::string::~string(local_50);
    if (local_8c != 0) {
      return;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "You should choose either player is a human or a computer. ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"If it is a computer, just press ENTER.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"If it is a human, just type the player name.");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  local_120 = local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"North",&local_121);
  local_120 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"East",&local_122);
  local_120 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"South",&local_123);
  local_120 = local_b8;
  std::allocator<char>::allocator();
  ctx = "West";
  std::__cxx11::string::string(local_b8,"West",&local_124);
  std::allocator<char>::~allocator((allocator<char> *)&local_124);
  std::allocator<char>::~allocator((allocator<char> *)&local_123);
  std::allocator<char>::~allocator((allocator<char> *)&local_122);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::string(local_148);
  for (local_14c = 0; local_14c < 4; local_14c = local_14c + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Player ");
    poVar3 = std::operator<<(poVar3,local_118 + (long)local_14c * 0x20);
    std::operator<<(poVar3," : ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_148);
    bVar2 = std::__cxx11::string::empty();
    local_219 = true;
    if ((bVar2 & 1) == 0) {
      local_219 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_148,"computer");
    }
    local_14d = local_219;
    if (local_219 != false) {
      std::operator+((char *)local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Computer ");
      std::__cxx11::string::operator=(local_148,local_170);
      std::__cxx11::string::~string(local_170);
    }
    pPVar5 = createPlayer(this,local_14d & 1);
    ppPVar6 = std::array<Player_*,_4UL>::operator[](&this->_players,(long)local_14c);
    *ppPVar6 = pPVar5;
    ppPVar6 = std::array<Player_*,_4UL>::operator[](&this->_players,(long)local_14c);
    pPVar5 = *ppPVar6;
    std::__cxx11::string::string(local_190,local_148);
    ctx = (char *)local_190;
    Player::setName(pPVar5,(string *)ctx);
    std::__cxx11::string::~string(local_190);
  }
  init(this,(EVP_PKEY_CTX *)ctx);
  makeMemento(this);
  std::__cxx11::string::~string(local_148);
  local_248 = asStack_98;
  do {
    local_248 = local_248 + -0x20;
    std::__cxx11::string::~string(local_248);
  } while (local_248 != local_118);
  return;
}

Assistant:

Game::Game() {
    cout << AdvancedConsole::Cursor(0, 0) << AdvancedConsole::Erase();
    cout << "Welcome to the Bridge Game." << endl << endl;

    Memento *mem = Memento::loadFile();
    if (mem) {
        cout << "Do you want to load last game?" << endl;
        string q;
        cout << "Yes(y) or No(n) : ";
        getline(std::cin, q);
        if (q == "y" || q == "Y" || q == "yes" || q == "YES") {
            this->reset(mem);
            _currentDeal = new Deal(_players, 0);
            _currentDeal->reset(mem);
            return;
        }
        cout << endl;
    }

    cout << "You should choose either player is a human or a computer. " << endl;
    cout << "If it is a computer, just press ENTER." << endl;
    cout << "If it is a human, just type the player name." << endl << endl;

    string list[4] = {"North", "East", "South", "West"};
    string name;
    for (int i = 0; i < 4; i++) {
        cout << "Player " << list[i] << " : ";
        getline(std::cin, name);
        bool isComputer = name.empty() || name == "computer";
        if (isComputer) name = "Computer " + list[i];

        _players[i] = createPlayer(isComputer);
        _players[i]->setName(name);
    }


    init();
    makeMemento();
}